

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VtabMakeWritable(Parse *pParse,Table *pTab)

{
  int iVar1;
  int iVar2;
  Table **ppTVar3;
  long lVar4;
  Parse *pPVar5;
  
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  iVar1 = pPVar5->nVtabLock;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if (pPVar5->apVtabLock[lVar4] == pTab) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  ppTVar3 = pPVar5->apVtabLock;
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    ppTVar3 = (Table **)sqlite3Realloc(ppTVar3,iVar1 * 8 + 8);
  }
  else {
    ppTVar3 = (Table **)0x0;
  }
  if (ppTVar3 == (Table **)0x0) {
    pPVar5->db->mallocFailed = '\x01';
  }
  else {
    pPVar5->apVtabLock = ppTVar3;
    iVar1 = pPVar5->nVtabLock;
    pPVar5->nVtabLock = iVar1 + 1;
    ppTVar3[iVar1] = pTab;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabMakeWritable(Parse *pParse, Table *pTab){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i, n;
  Table **apVtabLock;

  assert( IsVirtual(pTab) );
  for(i=0; i<pToplevel->nVtabLock; i++){
    if( pTab==pToplevel->apVtabLock[i] ) return;
  }
  n = (pToplevel->nVtabLock+1)*sizeof(pToplevel->apVtabLock[0]);
  apVtabLock = sqlite3_realloc(pToplevel->apVtabLock, n);
  if( apVtabLock ){
    pToplevel->apVtabLock = apVtabLock;
    pToplevel->apVtabLock[pToplevel->nVtabLock++] = pTab;
  }else{
    pToplevel->db->mallocFailed = 1;
  }
}